

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall
FlowGraph::RemoveBlock(FlowGraph *this,BasicBlock *block,GlobOpt *globOpt,bool tailDuping)

{
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *this_00;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *this_01;
  ushort uVar1;
  BasicBlock *pBVar2;
  Instr *instr;
  Instr *pIVar3;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar4;
  Loop *pLVar5;
  code *pcVar6;
  Loop **ppLVar7;
  bool bVar8;
  IRKind IVar9;
  undefined4 *puVar10;
  Type *ppFVar11;
  Loop **ppLVar12;
  byte bVar13;
  ushort uVar14;
  long lVar15;
  Func **ppFVar16;
  Instr *pIVar17;
  Iterator local_50;
  GlobOpt *local_40;
  FlowGraph *local_38;
  
  local_40 = globOpt;
  local_38 = this;
  if ((block->field_0x18 & 3) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xd34,"(!block->isDead && !block->isDeleted)",
                       "!block->isDead && !block->isDeleted");
    if (!bVar8) {
LAB_0040e26f:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar10 = 0;
  }
  pBVar2 = block->next;
  ppFVar16 = (Func **)&pBVar2->firstInstr;
  if (pBVar2 == (BasicBlock *)0x0) {
    ppFVar16 = &block->func;
  }
  lVar15 = 0x18;
  if (pBVar2 == (BasicBlock *)0x0) {
    lVar15 = 0xd0;
  }
  lVar15 = *(long *)((long)&(*ppFVar16)->m_alloc + lVar15);
  if (lVar15 == 0) {
    pIVar17 = (Instr *)0x0;
  }
  else {
    pIVar17 = *(Instr **)(lVar15 + 0x10);
  }
  instr = block->firstInstr;
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  while ((instr != pIVar17 && (instr->m_opcode != FunctionExit))) {
    pIVar3 = instr->m_next;
    if (instr == block->firstInstr) {
      IVar9 = instr->m_kind;
      if ((IVar9 != InstrKindLabel) && (IVar9 != InstrKindProfiledLabel)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0xd41,"(instr->IsLabelInstr())","instr->IsLabelInstr()");
        if (!bVar8) goto LAB_0040e26f;
        *puVar10 = 0;
        IVar9 = instr->m_kind;
        if ((IVar9 != InstrKindLabel) && (IVar9 != InstrKindProfiledLabel)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
          if (!bVar8) goto LAB_0040e26f;
          *puVar10 = 0;
          IVar9 = instr->m_kind;
        }
      }
      bVar13 = *(byte *)&instr[1].m_func & 0xfe;
      *(byte *)&instr[1].m_func = bVar13;
      if ((IVar9 != InstrKindLabel) && (IVar9 != InstrKindProfiledLabel)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
        if (!bVar8) goto LAB_0040e26f;
        *puVar10 = 0;
        bVar13 = *(byte *)&instr[1].m_func;
      }
      *(byte *)&instr[1].m_func = bVar13 & 0xfb;
      instr = pIVar3;
    }
    else {
      RemoveInstr(local_38,instr,local_40);
      instr = pIVar3;
    }
  }
  this_00 = &block->predList;
  local_50.list = &this_00->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  local_50.current = (NodeBase *)this_00;
  while( true ) {
    if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_50.current ==
        (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar8) goto LAB_0040e26f;
      *puVar10 = 0;
    }
    local_50.current =
         (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
          &((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_50.current)->
           super_SListNodeBase<Memory::ArenaAllocator>)->super_SListNodeBase<Memory::ArenaAllocator>
         ).next;
    if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_50.current ==
        local_50.list) break;
    bVar8 = local_40 != (GlobOpt *)0x0;
    ppFVar11 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_50);
    BasicBlock::RemoveSucc((*ppFVar11)->predBlock,block,local_38,false,bVar8);
  }
  this_01 = &block->succList;
  local_50.list = &this_01->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  local_50.current = (NodeBase *)this_01;
  do {
    if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_50.current ==
        (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar8) goto LAB_0040e26f;
      *puVar10 = 0;
    }
    pSVar4 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
             (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)&(local_50.current)->next
              )->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if (pSVar4 == local_50.list) {
      if (((block->field_0x18 & 4) != 0) && (local_38->loopList != (Loop *)0x0)) {
        ppLVar7 = &local_38->loopList;
        do {
          ppLVar12 = ppLVar7;
          pLVar5 = *ppLVar12;
          ppLVar7 = &pLVar5->next;
        } while (pLVar5 != block->loop);
        *ppLVar12 = *ppLVar7;
        local_38->hasLoop = local_38->loopList != (Loop *)0x0;
      }
      if (local_40 != (GlobOpt *)0x0) {
        block->field_0x18 = block->field_0x18 | 2;
        if ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
            (block->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
            super_SListNodeBase<Memory::ArenaAllocator>.next != this_00) {
          do {
            SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::MoveHeadTo
                      (&this_00->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>,
                       &(block->deadPredList).
                        super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
          } while ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
                   (this_00->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
                   super_SListNodeBase<Memory::ArenaAllocator>.next != this_00);
        }
        if ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
            (block->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
            super_SListNodeBase<Memory::ArenaAllocator>.next != this_01) {
          do {
            SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::MoveHeadTo
                      (&this_01->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>,
                       &(block->deadSuccList).
                        super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
          } while ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
                   (this_01->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
                   super_SListNodeBase<Memory::ArenaAllocator>.next != this_01);
        }
      }
      uVar1 = (ushort)*(undefined4 *)&block->field_0x18;
      uVar14 = uVar1 | 2;
      if (!tailDuping) {
        uVar14 = uVar1;
      }
      *(ushort *)&block->field_0x18 = uVar14 | 1;
      block->dataUseCount = 0;
      return;
    }
    bVar8 = local_40 != (GlobOpt *)0x0;
    local_50.current = (NodeBase *)pSVar4;
    ppFVar11 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_50);
    BasicBlock::RemovePred((*ppFVar11)->succBlock,block,local_38,false,bVar8);
  } while( true );
}

Assistant:

void
FlowGraph::RemoveBlock(BasicBlock *block, GlobOpt * globOpt, bool tailDuping)
{
    Assert(!block->isDead && !block->isDeleted);
    IR::Instr * lastInstr = nullptr;
    FOREACH_INSTR_IN_BLOCK_EDITING(instr, instrNext, block)
    {
        if (instr->m_opcode == Js::OpCode::FunctionExit)
        {
            // Removing FunctionExit causes problems downstream...
            // We could change the opcode, or have FunctionEpilog/FunctionExit to get
            // rid of the epilog.
            break;
        }
        if (instr == block->GetFirstInstr())
        {
            Assert(instr->IsLabelInstr());
            instr->AsLabelInstr()->m_isLoopTop = false;
            instr->AsLabelInstr()->m_hasNonBranchRef = false;
        }
        else
        {
            lastInstr = this->RemoveInstr(instr, globOpt);
        }
    } NEXT_INSTR_IN_BLOCK_EDITING;

    if (lastInstr)
    {
        block->SetLastInstr(lastInstr);
    }
    FOREACH_SLISTBASECOUNTED_ENTRY(FlowEdge*, edge, block->GetPredList())
    {
        edge->GetPred()->RemoveSucc(block, this, false, globOpt != nullptr);
    } NEXT_SLISTBASECOUNTED_ENTRY;

    FOREACH_SLISTBASECOUNTED_ENTRY(FlowEdge*, edge, block->GetSuccList())
    {
        edge->GetSucc()->RemovePred(block, this, false, globOpt != nullptr);
    } NEXT_SLISTBASECOUNTED_ENTRY;

    if (block->isLoopHeader && this->loopList)
    {
        // If loop graph is built, remove loop from loopList
        Loop **pPrevLoop = &this->loopList;

        while (*pPrevLoop != block->loop)
        {
            pPrevLoop = &((*pPrevLoop)->next);
        }
        *pPrevLoop = (*pPrevLoop)->next;
        this->hasLoop = (this->loopList != nullptr);
    }
    if (globOpt != nullptr)
    {
        block->isDead = true;
        block->GetPredList()->MoveTo(block->GetDeadPredList());
        block->GetSuccList()->MoveTo(block->GetDeadSuccList());
    }
    if (tailDuping)
    {
        block->isDead = true;
    }
    block->isDeleted = true;
    block->SetDataUseCount(0);
}